

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

uLong cm_zlib_crc32_combine_op(uLong crc1,uLong crc2,uLong op)

{
  z_crc_t zVar1;
  uLong op_local;
  uLong crc2_local;
  uLong crc1_local;
  
  zVar1 = multmodp((z_crc_t)op,(z_crc_t)crc1);
  return zVar1 ^ crc2;
}

Assistant:

uLong crc32_combine_op(crc1, crc2, op)
    uLong crc1;
    uLong crc2;
    uLong op;
{
    return multmodp(op, crc1) ^ crc2;
}